

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

bool __thiscall clickhouse::Client::Impl::SendHello(Impl *this)

{
  CodedOutputStream *this_00;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = &this->output_;
  CodedOutputStream::WriteVarint64(this_00,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ClickHouse",&local_59);
  std::operator+(&local_58,&local_38," client");
  WireFormat::WriteString(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  CodedOutputStream::WriteVarint64(this_00,1);
  CodedOutputStream::WriteVarint64(this_00,1);
  CodedOutputStream::WriteVarint64(this_00,0xd481);
  WireFormat::WriteString(this_00,&(this->options_).default_database);
  WireFormat::WriteString(this_00,&(this->options_).user);
  WireFormat::WriteString(this_00,&(this->options_).password);
  CodedOutputStream::Flush(this_00);
  return true;
}

Assistant:

bool Client::Impl::SendHello() {
    WireFormat::WriteUInt64(&output_, ClientCodes::Hello);
    WireFormat::WriteString(&output_, std::string(DBMS_NAME) + " client");
    WireFormat::WriteUInt64(&output_, DBMS_VERSION_MAJOR);
    WireFormat::WriteUInt64(&output_, DBMS_VERSION_MINOR);
    WireFormat::WriteUInt64(&output_, REVISION);
    WireFormat::WriteString(&output_, options_.default_database);
    WireFormat::WriteString(&output_, options_.user);
    WireFormat::WriteString(&output_, options_.password);

    output_.Flush();

    return true;
}